

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O2

HTTPAPIEX_RESULT HTTPAPIEX_SetOption(HTTPAPIEX_HANDLE handle,char *optionName,void *value)

{
  HTTPAPI_RESULT HVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  void *pvVar4;
  HTTPAPIEX_RESULT HVar5;
  char *pcVar6;
  undefined8 uVar7;
  void *savedOption;
  char *local_38;
  void *local_30;
  
  if ((optionName == (char *)0x0 || handle == (HTTPAPIEX_HANDLE)0x0) || value == (void *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return HTTPAPIEX_INVALID_ARG;
    }
    iVar2 = 0x2a9;
LAB_0017c7ab:
    HVar5 = HTTPAPIEX_INVALID_ARG;
    uVar7 = 3;
    pcVar6 = HTTPAPIEX_RESULTStringStorage[3];
  }
  else {
    HVar1 = HTTPAPI_CloneOption(optionName,value,&savedOption);
    if (HVar1 == HTTPAPI_OK) {
      pvVar4 = VECTOR_find_if(handle->savedOptions,sameName,optionName);
      if (pvVar4 == (void *)0x0) {
        iVar2 = mallocAndStrcpy_s(&local_38,optionName);
        if (iVar2 == 0) {
          local_30 = savedOption;
          iVar2 = VECTOR_push_back(handle->savedOptions,&local_38,1);
          if (iVar2 == 0) goto LAB_0017c7ea;
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiex.c"
                      ,"createOrUpdateOption",0x28d,1,"unable to VECTOR_push_back");
          }
          free(local_38);
        }
        free(savedOption);
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return HTTPAPIEX_ERROR;
        }
        iVar2 = 0x2c7;
      }
      else {
        free(*(void **)((long)pvVar4 + 8));
        *(void **)((long)pvVar4 + 8) = savedOption;
LAB_0017c7ea:
        if (handle->httpHandle == (HTTP_HANDLE)0x0) {
          return HTTPAPIEX_OK;
        }
        HVar1 = HTTPAPI_SetOption(handle->httpHandle,optionName,value);
        if (HVar1 == HTTPAPI_OK) {
          return HTTPAPIEX_OK;
        }
        if (HVar1 == HTTPAPI_INVALID_ARG) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return HTTPAPIEX_INVALID_ARG;
          }
          iVar2 = 0x2d7;
          goto LAB_0017c7ab;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return HTTPAPIEX_ERROR;
        }
        iVar2 = 0x2dc;
      }
    }
    else {
      if (HVar1 == HTTPAPI_INVALID_ARG) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return HTTPAPIEX_INVALID_ARG;
        }
        iVar2 = 0x2b7;
        goto LAB_0017c7ab;
      }
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return HTTPAPIEX_ERROR;
      }
      iVar2 = 0x2bd;
    }
    HVar5 = HTTPAPIEX_ERROR;
    uVar7 = 2;
    pcVar6 = HTTPAPIEX_RESULTStringStorage[2];
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiex.c"
            ,"HTTPAPIEX_SetOption",iVar2,1,"error code = %s%s (%d)","",pcVar6,uVar7);
  return HVar5;
}

Assistant:

HTTPAPIEX_RESULT HTTPAPIEX_SetOption(HTTPAPIEX_HANDLE handle, const char* optionName, const void* value)
{
    HTTPAPIEX_RESULT result;
    /*Codes_SRS_HTTPAPIEX_02_032: [If parameter handle is NULL then HTTPAPIEX_SetOption shall return HTTPAPIEX_INVALID_ARG.] */
    /*Codes_SRS_HTTPAPIEX_02_033: [If parameter optionName is NULL then HTTPAPIEX_SetOption shall return HTTPAPIEX_INVALID_ARG.] */
    /*Codes_SRS_HTTPAPIEX_02_034: [If parameter value is NULL then HTTPAPIEX_SetOption shall return HTTPAPIEX_INVALID_ARG.] */
    if (
        (handle == NULL) ||
        (optionName == NULL) ||
        (value == NULL)
        )
    {
        result = HTTPAPIEX_INVALID_ARG;
        LOG_HTTAPIEX_ERROR();
    }
    else
    {
        const void* savedOption;
        HTTPAPI_RESULT saveOptionResult;

        /*Codes_SRS_HTTPAPIEX_02_037: [HTTPAPIEX_SetOption shall attempt to save the value of the option by calling HTTPAPI_CloneOption passing optionName and value, irrespective of the existence of a HTTPAPI_HANDLE] */
        saveOptionResult = HTTPAPI_CloneOption(optionName, value, &savedOption);

        if(saveOptionResult == HTTPAPI_INVALID_ARG)
        {
            /*Codes_SRS_HTTPAPIEX_02_038: [If HTTPAPI_CloneOption returns HTTPAPI_INVALID_ARG then HTTPAPIEX shall return HTTPAPIEX_INVALID_ARG.] */
            result = HTTPAPIEX_INVALID_ARG;
            LOG_HTTAPIEX_ERROR();
        }
        else if (saveOptionResult != HTTPAPI_OK)
        {
            /*Codes_SRS_HTTPAPIEX_02_040: [For all other return values of HTTPAPI_SetOption, HTTPIAPIEX_SetOption shall return HTTPAPIEX_ERROR.] */
            result = HTTPAPIEX_ERROR;
            LOG_HTTAPIEX_ERROR();
        }
        else
        {
            HTTPAPIEX_HANDLE_DATA* handleData = (HTTPAPIEX_HANDLE_DATA*)handle;
            /*Codes_SRS_HTTPAPIEX_02_039: [If HTTPAPI_CloneOption returns HTTPAPI_OK then HTTPAPIEX_SetOption shall create or update the pair optionName/value.]*/
            if (createOrUpdateOption(handleData, optionName, savedOption) != 0)
            {
                /*Codes_SRS_HTTPAPIEX_02_041: [If creating or updating the pair optionName/value fails then shall return HTTPAPIEX_ERROR.] */
                result = HTTPAPIEX_ERROR;
                LOG_HTTAPIEX_ERROR();

            }
            else
            {
                /*Codes_SRS_HTTPAPIEX_02_031: [If HTTPAPI_HANDLE exists then HTTPAPIEX_SetOption shall call HTTPAPI_SetOption passing the same optionName and value and shall return a value conforming to the below table:] */
                if (handleData->httpHandle != NULL)
                {
                    HTTPAPI_RESULT HTTPAPI_result = HTTPAPI_SetOption(handleData->httpHandle, optionName, value);
                    if (HTTPAPI_result == HTTPAPI_OK)
                    {
                        result = HTTPAPIEX_OK;
                    }
                    else if (HTTPAPI_result == HTTPAPI_INVALID_ARG)
                    {
                        result = HTTPAPIEX_INVALID_ARG;
                        LOG_HTTAPIEX_ERROR();
                    }
                    else
                    {
                        result = HTTPAPIEX_ERROR;
                        LOG_HTTAPIEX_ERROR();
                    }
                }
                else
                {
                    result = HTTPAPIEX_OK;
                }
            }
        }
    }
    return result;
}